

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

int google::protobuf::CEscapeInternal
              (char *src,int src_len,char *dest,int dest_len,bool use_hex,bool utf8_safe)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  char *__format;
  byte *pbVar4;
  undefined3 in_register_00000081;
  int iVar5;
  
  pbVar4 = (byte *)(src + src_len);
  __format = "\\%03o";
  if (CONCAT31(in_register_00000081,use_hex) != 0) {
    __format = "\\x%02x";
  }
  iVar5 = 0;
  uVar1 = 0;
  do {
    if (pbVar4 <= src) {
      iVar2 = -1;
      if (iVar5 < dest_len) {
        dest[iVar5] = '\0';
        iVar2 = iVar5;
      }
      return iVar2;
    }
    if (dest_len - iVar5 < 2) {
      return -1;
    }
    bVar3 = *src;
    if (bVar3 == 9) {
      (dest + iVar5)[0] = '\\';
      (dest + iVar5)[1] = 't';
LAB_002cdbca:
      iVar5 = iVar5 + 2;
LAB_002cdbce:
      uVar1 = 0;
    }
    else {
      if (bVar3 == 0x5c) {
        (dest + iVar5)[0] = '\\';
        (dest + iVar5)[1] = '\\';
        goto LAB_002cdbca;
      }
      if (bVar3 == 0xd) {
        (dest + iVar5)[0] = '\\';
        (dest + iVar5)[1] = 'r';
        goto LAB_002cdbca;
      }
      if (bVar3 == 0x22) {
        (dest + iVar5)[0] = '\\';
        (dest + iVar5)[1] = '\"';
        goto LAB_002cdbca;
      }
      if (bVar3 == 0x27) {
        (dest + iVar5)[0] = '\\';
        (dest + iVar5)[1] = '\'';
        goto LAB_002cdbca;
      }
      if (bVar3 == 10) {
        (dest + iVar5)[0] = '\\';
        (dest + iVar5)[1] = 'n';
        goto LAB_002cdbca;
      }
      if ((char)bVar3 < '\0' && utf8_safe) {
LAB_002cdbb1:
        dest[iVar5] = bVar3;
        iVar5 = iVar5 + 1;
        goto LAB_002cdbce;
      }
      if ((byte)(bVar3 - 0x20) < 0x5f) {
        if ((uVar1 & 1) != 0) {
          iVar2 = isxdigit((int)(char)bVar3);
          if ((char)iVar2 != '\0') goto LAB_002cdc00;
          bVar3 = *src;
        }
        goto LAB_002cdbb1;
      }
LAB_002cdc00:
      if ((uint)(dest_len - iVar5) < 4) {
        return -1;
      }
      sprintf(dest + iVar5,__format,(ulong)(byte)*src);
      iVar5 = iVar5 + 4;
      uVar1 = CONCAT31(in_register_00000081,use_hex);
    }
    src = (char *)((byte *)src + 1);
  } while( true );
}

Assistant:

int CEscapeInternal(const char* src, int src_len, char* dest,
                    int dest_len, bool use_hex, bool utf8_safe) {
  const char* src_end = src + src_len;
  int used = 0;
  bool last_hex_escape = false; // true if last output char was \xNN

  for (; src < src_end; src++) {
    if (dest_len - used < 2)   // Need space for two letter escape
      return -1;

    bool is_hex_escape = false;
    switch (*src) {
      case '\n': dest[used++] = '\\'; dest[used++] = 'n';  break;
      case '\r': dest[used++] = '\\'; dest[used++] = 'r';  break;
      case '\t': dest[used++] = '\\'; dest[used++] = 't';  break;
      case '\"': dest[used++] = '\\'; dest[used++] = '\"'; break;
      case '\'': dest[used++] = '\\'; dest[used++] = '\''; break;
      case '\\': dest[used++] = '\\'; dest[used++] = '\\'; break;
      default:
        // Note that if we emit \xNN and the src character after that is a hex
        // digit then that digit must be escaped too to prevent it being
        // interpreted as part of the character code by C.
        if ((!utf8_safe || static_cast<uint8>(*src) < 0x80) &&
            (!isprint(*src) ||
             (last_hex_escape && isxdigit(*src)))) {
          if (dest_len - used < 4) // need space for 4 letter escape
            return -1;
          sprintf(dest + used, (use_hex ? "\\x%02x" : "\\%03o"),
                  static_cast<uint8>(*src));
          is_hex_escape = use_hex;
          used += 4;
        } else {
          dest[used++] = *src; break;
        }
    }
    last_hex_escape = is_hex_escape;
  }

  if (dest_len - used < 1)   // make sure that there is room for \0
    return -1;

  dest[used] = '\0';   // doesn't count towards return value though
  return used;
}